

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

Balk * __thiscall
Parser::get_balk_from_file(Balk *__return_storage_ptr__,Parser *this,string *file_name)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  istream *piVar4;
  ParseError *pPVar5;
  double local_418;
  double value;
  int local_408;
  int shift_end;
  int shift;
  char type;
  double J;
  double E;
  double segment_length;
  long lStack_3e0;
  int balk_size;
  stringstream stream;
  string local_258 [8];
  string line;
  long local_228;
  ifstream file;
  string *file_name_local;
  Parser *this_local;
  Balk *balk;
  
  std::ifstream::ifstream(&local_228,(string *)file_name,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::string(local_258);
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&local_228,local_258);
    _Var3 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)&stack0xfffffffffffffc20,local_258,_Var3);
    std::istream::operator>>((istream *)&stack0xfffffffffffffc20,(int *)((long)&segment_length + 4))
    ;
    std::istream::operator>>((istream *)&stack0xfffffffffffffc20,&E);
    piVar4 = (istream *)std::istream::operator>>((istream *)&stack0xfffffffffffffc20,&J);
    std::istream::operator>>(piVar4,(double *)&shift);
    shift_end._3_1_ = 0;
    Balk::Balk(__return_storage_ptr__,segment_length._4_4_,E,J,_shift);
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&local_228,local_258);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if (!bVar2) break;
      std::ios::clear((undefined1 *)((long)&stack0xfffffffffffffc20 + *(long *)(lStack_3e0 + -0x18))
                      ,0);
      std::__cxx11::stringstream::str((string *)&stack0xfffffffffffffc20);
      piVar4 = std::operator>>((istream *)&stack0xfffffffffffffc20,(char *)((long)&shift_end + 2));
      std::istream::operator>>(piVar4,&local_408);
      switch(shift_end._2_1_) {
      case 0x4b:
        std::istream::operator>>((istream *)&stack0xfffffffffffffc20,&local_418);
        Balk::add_elastic_support(__return_storage_ptr__,local_408,E,local_418);
        break;
      default:
        pPVar5 = (ParseError *)__cxa_allocate_exception(0x10);
        ParseError::runtime_error(pPVar5,"Unknown term");
        __cxa_throw(pPVar5,&ParseError::typeinfo,ParseError::~ParseError);
      case 0x4d:
        std::istream::operator>>((istream *)&stack0xfffffffffffffc20,&local_418);
        Balk::add_moment(__return_storage_ptr__,local_408,E,local_418);
        break;
      case 0x50:
        std::istream::operator>>((istream *)&stack0xfffffffffffffc20,&local_418);
        Balk::add_concentrated_power(__return_storage_ptr__,local_408,E,local_418);
        break;
      case 0x51:
        piVar4 = (istream *)
                 std::istream::operator>>
                           ((istream *)&stack0xfffffffffffffc20,(int *)((long)&value + 4));
        std::istream::operator>>(piVar4,&local_418);
        Balk::add_uniform_load(__return_storage_ptr__,local_408,E,local_418);
        if (value._4_4_ != segment_length._4_4_) {
          Balk::add_uniform_load(__return_storage_ptr__,value._4_4_,E,-local_418);
        }
        break;
      case 0x52:
        Balk::add_hinge_support(__return_storage_ptr__,local_408,E);
        break;
      case 0x5a:
        Balk::add_hard_pinching(__return_storage_ptr__,local_408,E);
      }
    }
    std::ifstream::close();
    shift_end._3_1_ = 1;
    std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffc20);
    std::__cxx11::string::~string(local_258);
    std::ifstream::~ifstream(&local_228);
    return __return_storage_ptr__;
  }
  pPVar5 = (ParseError *)__cxa_allocate_exception(0x10);
  ParseError::runtime_error(pPVar5,"Cannot open Input file");
  __cxa_throw(pPVar5,&ParseError::typeinfo,ParseError::~ParseError);
}

Assistant:

Balk Parser::get_balk_from_file(const std::string &file_name)
{
    std::ifstream file{file_name};
    if (!file) {
        throw ParseError("Cannot open Input file");
    }

    std::string line;
    std::getline(file, line);
    std::stringstream stream(line);

    int balk_size;
    double segment_length;
    double E, J;
    stream >> balk_size;
    stream >> segment_length;
    stream >> E >> J;
    Balk balk(balk_size, segment_length, E, J);

    // Parse conditions
    while (std::getline(file, line))
    {
        stream.clear();
        stream.str(line);

        char type;
        int shift, shift_end;
        double value;

        // Read the type of expression
        stream >> type >> shift;

        switch (type)
        {
        case 'R':
            balk.add_hinge_support(shift, segment_length);
            break;
        case 'K':
            stream >> value;
            balk.add_elastic_support(shift, segment_length, value);
            break;

        case 'Z':
            balk.add_hard_pinching(shift, segment_length);
            break;

        case 'P':
            stream >> value;
            balk.add_concentrated_power(shift, segment_length, value);
            break;

        case 'M':
            stream >> value;
            balk.add_moment(shift, segment_length, value);
            break;

        case 'Q':
            stream >> shift_end >> value;
            balk.add_uniform_load(shift, segment_length, value);
            if (shift_end != balk_size)
            {
                balk.add_uniform_load(shift_end, segment_length, -value);
            }
            break;

        default:
            throw ParseError("Unknown term");
        }
    }
    file.close();
    return balk;
}